

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O3

kStatus __thiscall gnilk::Log::Info<char_const*>(Log *this,char *arguments)

{
  undefined1 auVar1 [16];
  int iVar2;
  size_t sVar3;
  kStatus kVar4;
  basic_string_view<char> format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  string local_268;
  undefined1 local_248 [16];
  buffer<char> local_238;
  char local_218 [504];
  
  kVar4 = kFiltered;
  if ((this->isEnabled == true) && ((int)this->logLevelThreshold < 0xc9)) {
    sVar3 = strlen(arguments);
    local_238.size_ = 0;
    local_238._vptr_buffer = (_func_int **)&PTR_grow_0021e498;
    local_238.capacity_ = 500;
    format.size_ = sVar3;
    format.data_ = arguments;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_248;
    local_238.ptr_ = local_218;
    ::fmt::v10::detail::vprintf<char,fmt::v10::basic_printf_context<char>>
              (&local_238,format,
               (basic_format_args<fmt::v10::basic_printf_context<char>_>)(auVar1 << 0x40));
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,local_238.ptr_,local_238.ptr_ + local_238.size_);
    if (local_238.ptr_ != local_218) {
      operator_delete(local_238.ptr_,local_238.capacity_);
    }
    iVar2 = SendLogMessage(this,kInfo,&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    kVar4 = (uint)(iVar2 < 1) * 2;
  }
  return kVar4;
}

Assistant:

inline kStatus Info(T... arguments) const {
            if (!(isEnabled && WithinRange(kInfo))) return kStatus::kFiltered;
            auto str = fmt::sprintf(arguments...);
            return (SendLogMessage(kInfo, str) > 0) ? kStatus::kOk : kStatus::kSendError;
        }